

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

iterator __thiscall
estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
          (vector_s<unsigned_int,12ul> *this,const_iterator pos,uint *first,uint *last)

{
  pointer insert_ptr;
  uint *puVar1;
  range_error *this_00;
  code *pcVar2;
  long lVar3;
  ulong uVar4;
  undefined *puVar5;
  const_iterator __s;
  uint *it;
  
  lVar3 = (long)last - (long)first >> 2;
  if (lVar3 < 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              ((out_of_range *)this_00,
               "cas::vector_s range constructing/assigning from inverted range.");
    puVar5 = &std::out_of_range::typeinfo;
    pcVar2 = std::out_of_range::~out_of_range;
  }
  else {
    uVar4 = lVar3 + *(long *)this;
    if (uVar4 < 0xd) {
      __s = (const_iterator)(*(long *)this * 4 + *(long *)(this + 0x38));
      if (-1 < (long)__s - (long)pos) {
        if ((long)last - (long)first != 0) {
          memset(__s,0,(long)last - (long)first);
        }
        if (__s != pos) {
          do {
            *(value_type_conflict *)((long)__s + ((long)last - (long)first) + -4) = __s[-1];
            __s = __s + -1;
          } while (__s != pos);
        }
      }
      puVar1 = pos;
      if (first != last) {
        do {
          *puVar1 = *first;
          first = first + 1;
          puVar1 = puVar1 + 1;
        } while (first != last);
      }
      *(ulong *)this = uVar4;
      return pos;
    }
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s inserting beyond capacity.");
    puVar5 = &std::range_error::typeinfo;
    pcVar2 = std::range_error::~range_error;
  }
  __cxa_throw(this_00,puVar5,pcVar2);
}

Assistant:

iterator insert (const_iterator pos, InputIt first, InputIt last)
    {
        const std::int64_t count_signed = last - first;
        if (count_signed < 0) {
            ESTL_THROW (std::out_of_range, "cas::vector_s range constructing/assigning from inverted range.");
            return end();
        }
        const size_type count = static_cast<size_type>(count_signed);
        const size_type new_size = size() + count;
        if (new_size > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s inserting beyond capacity.");
            return end();
        }

        const iterator ipos_start = const_cast<iterator>(pos);
        iterator ipos = ipos_start;
        shift_right(ipos, end(), count);
        for (InputIt it = first; it != last; ++it, ++ipos) {
            const pointer insert_ptr = static_cast<pointer>(ipos);
            new (insert_ptr) value_type(*it);
            // *ipos = *it; // TODO: This seems ok too since the extra elements are already "allocated" by shift_right
        }
        size_ = new_size;
        return ipos_start;
    }